

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O2

_Bool compare_input_and_nyt
                (byte_t *input_buffer,long in_bit_idx,long last_bit_idx,bit_array_t *bit_array_nyt)

{
  byte_t bVar1;
  uint bit_pos;
  long lVar2;
  ulong uVar3;
  _Bool _Var4;
  
  uVar3 = (ulong)bit_array_nyt->length;
  if (last_bit_idx - in_bit_idx < (long)uVar3) {
    _Var4 = false;
  }
  else {
    do {
      _Var4 = uVar3 == 0;
      if (_Var4) {
        return _Var4;
      }
      lVar2 = bit_idx_to_byte_idx(in_bit_idx);
      bVar1 = input_buffer[lVar2];
      bit_pos = bit_pos_in_current_byte(in_bit_idx);
      bVar1 = bit_check(bVar1,bit_pos);
      in_bit_idx = in_bit_idx + 1;
      lVar2 = uVar3 - 1;
      uVar3 = uVar3 - 1;
    } while (bVar1 == bit_array_nyt->buffer[lVar2]);
  }
  return _Var4;
}

Assistant:

bool compare_input_and_nyt(const byte_t *input_buffer,
        long in_bit_idx,
        long last_bit_idx,
        const bit_array_t *bit_array_nyt) {
    int size = bit_array_nyt->length;
    if(last_bit_idx - in_bit_idx < size)
        return false;

#ifdef _DEBUG
        log_debug("compare_input_and_nyt", "in_bit_idx=%-8d NYT=%s\n",
              in_bit_idx,
              fmt_bit_array(bit_array_nyt));
#endif

    bool have_same_bits = true;
    for(int offset=0; offset<size; offset++) {
        long byte_idx = bit_idx_to_byte_idx(in_bit_idx + offset);
        byte_t input_byte = input_buffer[byte_idx];

        int input_byte_bit_idx = bit_pos_in_current_byte(in_bit_idx + offset);
        byte_t value = bit_check(input_byte, (unsigned int)input_byte_bit_idx);
        if(value != bit_array_nyt->buffer[size-offset-1]) {
            have_same_bits = false;
            break;
        }
    }
    return have_same_bits;
}